

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.h
# Opt level: O2

bool __thiscall Clasp::Solver::setReason(Solver *this,Literal p,Antecedent *x,uint32 data)

{
  (this->assign_).reason_.super_type.ebo_.buf[p.rep_ >> 2].data_ = x->data_;
  if (data != 0xffffffff) {
    ReasonStore64::setData(&(this->assign_).reason_,p.rep_ >> 2,data);
  }
  return true;
}

Assistant:

Var var() const { return rep_ >> sign_bit; }